

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.test.cpp
# Opt level: O3

string * chunkMF2_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.001000+3 9.991673-1          0          0          1          0 125 2151     \n 1.001000+3 1.000000+0          0          0          1          0 125 2151     \n 1.000000-5 1.000000+5          0          0          0          0 125 2151     \n 5.000000-1 1.276553+0          0          0          0          0 125 2151     \n                                                                   125 2  0     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkMF2() {

  // this is a dummy MF2, it is ENDF legal
  return
    " 1.001000+3 9.991673-1          0          0          1          0 125 2151     \n"
    " 1.001000+3 1.000000+0          0          0          1          0 125 2151     \n"
    " 1.000000-5 1.000000+5          0          0          0          0 125 2151     \n"
    " 5.000000-1 1.276553+0          0          0          0          0 125 2151     \n"
    "                                                                   125 2  0     \n";
}